

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Builder * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::getSchema
          (Builder *__return_storage_ptr__,MemberInfo *this)

{
  anon_union_40_1_a8c68091_for_NullableValue<capnp::schema::Field::Builder>_2 *paVar1;
  uint uVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  WirePointer *pWVar5;
  Maybe<capnp::schema::Field::Builder> *pMVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  Builder *result;
  FieldSourceInfoBuilderPair builderPair;
  PointerBuilder local_88;
  FieldSourceInfoBuilderPair local_70;
  
  paVar1 = &(this->schema).ptr.field_1;
  if ((this->schema).ptr.isSet == true) {
    pMVar6 = &this->schema;
    SVar7 = *(StructPointerCount *)((long)&(pMVar6->ptr).field_1 + 0x24);
    uVar8 = *(undefined2 *)((long)&(pMVar6->ptr).field_1 + 0x26);
    (__return_storage_ptr__->_builder).dataSize =
         *(StructDataBitCount *)((long)&(pMVar6->ptr).field_1 + 0x20);
    (__return_storage_ptr__->_builder).pointerCount = SVar7;
    *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar8;
    pSVar3 = (paVar1->value)._builder.segment;
    pCVar4 = (this->schema).ptr.field_1.value._builder.capTable;
    pWVar5 = (this->schema).ptr.field_1.value._builder.pointers;
    (__return_storage_ptr__->_builder).data = (this->schema).ptr.field_1.value._builder.data;
    (__return_storage_ptr__->_builder).pointers = pWVar5;
    (__return_storage_ptr__->_builder).segment = pSVar3;
    (__return_storage_ptr__->_builder).capTable = pCVar4;
  }
  else {
    this->index = this->parent->childInitializedCount;
    addMemberSchema(&local_70,this->parent);
    (__return_storage_ptr__->_builder).dataSize = local_70.field._builder.dataSize;
    (__return_storage_ptr__->_builder).pointerCount = local_70.field._builder.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = local_70.field._builder._38_2_;
    (__return_storage_ptr__->_builder).data = local_70.field._builder.data;
    (__return_storage_ptr__->_builder).pointers = local_70.field._builder.pointers;
    (__return_storage_ptr__->_builder).segment = local_70.field._builder.segment;
    (__return_storage_ptr__->_builder).capTable = local_70.field._builder.capTable;
    if (this->isInUnion == true) {
      uVar2 = this->parent->unionDiscriminantCount;
      this->parent->unionDiscriminantCount = uVar2 + 1;
      *(ushort *)((long)(__return_storage_ptr__->_builder).data + 2) = ~(ushort)uVar2;
    }
    local_88.segment = (__return_storage_ptr__->_builder).segment;
    local_88.capTable = (__return_storage_ptr__->_builder).capTable;
    local_88.pointer = (__return_storage_ptr__->_builder).pointers;
    capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_88,(Reader)(this->name).content);
    *(short *)(__return_storage_ptr__->_builder).data = (short)this->codeOrder;
    if ((this->docComment).ptr.isSet == true) {
      local_88.segment = local_70.sourceInfo._builder.segment;
      local_88.capTable = local_70.sourceInfo._builder.capTable;
      local_88.pointer = local_70.sourceInfo._builder.pointers;
      capnp::_::PointerBuilder::setBlob<capnp::Text>
                (&local_88,(Reader)(this->docComment).ptr.field_1.value.super_StringPtr.content);
    }
    *(uint *)local_70.sourceInfo._builder.data = this->startByte;
    *(uint *)((long)local_70.sourceInfo._builder.data + 4) = this->endByte;
    if ((this->schema).ptr.isSet == true) {
      (this->schema).ptr.isSet = false;
    }
    SVar7 = (__return_storage_ptr__->_builder).pointerCount;
    uVar8 = *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26;
    pMVar6 = &this->schema;
    *(StructDataBitCount *)((long)&(pMVar6->ptr).field_1 + 0x20) =
         (__return_storage_ptr__->_builder).dataSize;
    *(StructPointerCount *)((long)&(pMVar6->ptr).field_1 + 0x24) = SVar7;
    *(undefined2 *)((long)&(pMVar6->ptr).field_1 + 0x26) = uVar8;
    pSVar3 = (__return_storage_ptr__->_builder).segment;
    pCVar4 = (__return_storage_ptr__->_builder).capTable;
    pWVar5 = (__return_storage_ptr__->_builder).pointers;
    (this->schema).ptr.field_1.value._builder.data = (__return_storage_ptr__->_builder).data;
    (this->schema).ptr.field_1.value._builder.pointers = pWVar5;
    (paVar1->value)._builder.segment = pSVar3;
    (this->schema).ptr.field_1.value._builder.capTable = pCVar4;
    (this->schema).ptr.isSet = true;
  }
  return __return_storage_ptr__;
}

Assistant:

schema::Field::Builder getSchema() {
      KJ_IF_SOME(result, schema) {
        return result;
      } else {
        index = parent->childInitializedCount;
        auto builderPair = parent->addMemberSchema();
        auto builder = builderPair.field;
        if (isInUnion) {
          builder.setDiscriminantValue(parent->unionDiscriminantCount++);
        }
        builder.setName(name);
        builder.setCodeOrder(codeOrder);

        KJ_IF_SOME(dc, docComment) {
          builderPair.sourceInfo.setDocComment(dc);
        }
        builderPair.sourceInfo.setStartByte(startByte);
        builderPair.sourceInfo.setEndByte(endByte);

        schema = builder;
        return builder;
      }